

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.cpp
# Opt level: O2

void __thiscall btPoint2PointConstraint::buildJacobian(btPoint2PointConstraint *this)

{
  btRigidBody *pbVar1;
  btRigidBody *pbVar2;
  btJacobianEntry *this_00;
  int i;
  long lVar3;
  btVector3 local_f8;
  btVector3 *local_e0;
  btVector3 *local_d8;
  btVector3 local_d0;
  btVector3 local_c0;
  btVector3 local_b0;
  btVector3 local_a0;
  btMatrix3x3 local_90;
  btMatrix3x3 local_60;
  
  (this->super_btTypedConstraint).m_appliedImpulse = 0.0;
  this_00 = this->m_jac;
  local_d8 = &this->m_pivotInA;
  local_e0 = &this->m_pivotInB;
  local_f8.m_floats[0] = 0.0;
  local_f8.m_floats[1] = 0.0;
  local_f8.m_floats[2] = 0.0;
  local_f8.m_floats[3] = 0.0;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    local_f8.m_floats[lVar3] = 1.0;
    btMatrix3x3::transpose
              (&local_60,
               &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).m_worldTransform.
                m_basis);
    btMatrix3x3::transpose
              (&local_90,
               &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).m_worldTransform.
                m_basis);
    local_b0 = btTransform::operator()
                         (&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                           m_worldTransform,local_d8);
    local_a0 = operator-(&local_b0,
                         &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                          m_worldTransform.m_origin);
    local_d0 = btTransform::operator()
                         (&(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                           m_worldTransform,local_e0);
    local_c0 = operator-(&local_d0,
                         &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                          m_worldTransform.m_origin);
    pbVar1 = (this->super_btTypedConstraint).m_rbA;
    pbVar2 = (this->super_btTypedConstraint).m_rbB;
    btJacobianEntry::btJacobianEntry
              (this_00,&local_60,&local_90,&local_a0,&local_c0,&local_f8,&pbVar1->m_invInertiaLocal,
               pbVar1->m_inverseMass,&pbVar2->m_invInertiaLocal,pbVar2->m_inverseMass);
    local_f8.m_floats[lVar3] = 0.0;
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

void	btPoint2PointConstraint::buildJacobian()
{

	///we need it for both methods
	{
		m_appliedImpulse = btScalar(0.);

		btVector3	normal(0,0,0);

		for (int i=0;i<3;i++)
		{
			normal[i] = 1;
			new (&m_jac[i]) btJacobianEntry(
			m_rbA.getCenterOfMassTransform().getBasis().transpose(),
			m_rbB.getCenterOfMassTransform().getBasis().transpose(),
			m_rbA.getCenterOfMassTransform()*m_pivotInA - m_rbA.getCenterOfMassPosition(),
			m_rbB.getCenterOfMassTransform()*m_pivotInB - m_rbB.getCenterOfMassPosition(),
			normal,
			m_rbA.getInvInertiaDiagLocal(),
			m_rbA.getInvMass(),
			m_rbB.getInvInertiaDiagLocal(),
			m_rbB.getInvMass());
		normal[i] = 0;
		}
	}


}